

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_897d::test_art_upper_bound(void **param_1)

{
  _Bool _Var1;
  long lVar2;
  size_t i;
  ulong uVar3;
  initializer_list<const_char_*> __l;
  initializer_list<unsigned_long> __l_00;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  art_iterator_t iterator;
  art_t art;
  
  art.first_free[3] = (uint64_t)anon_var_dwarf_196;
  art.first_free[1] = (uint64_t)anon_var_dwarf_182;
  art.first_free[2] = (uint64_t)anon_var_dwarf_18c;
  art.root = (art_ref_t)anon_var_dwarf_162;
  art.first_free[0] = (uint64_t)anon_var_dwarf_178;
  __l._M_len = 5;
  __l._M_array = (iterator)&art;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&keys,__l,(allocator_type *)&iterator);
  art.first_free[1] = 3;
  art.first_free[2] = 4;
  art.root = 1;
  art.first_free[0] = 2;
  art.first_free[3] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = &art.root;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&values,__l_00,(allocator_type *)&iterator);
  art_init_cleared((art_t *)&art);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    art_insert((art_t *)&art,
               (art_key_chunk_t *)
               keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3],
               values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3]);
    assert_art_valid(&art);
  }
  art_upper_bound((art_iterator_t *)&iterator,(art_t *)&art,(art_key_chunk_t *)"000002");
  lVar2 = 0x10;
  do {
    _assert_true((ulong)(iterator.value != (art_val_t *)0x0),"iterator.value != NULL",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x206);
    assert_key_eq((art_key_chunk_t *)&iterator,
                  *(art_key_chunk_t **)
                   ((long)keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar2));
    _assert_true((ulong)(*iterator.value ==
                        *(art_val_t *)
                         ((long)values.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar2)),
                 "*iterator.value == values[i]",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
                 ,0x208);
    _Var1 = art_iterator_next((art_iterator_t *)&iterator);
    lVar2 = lVar2 + 8;
  } while (_Var1);
  art_upper_bound((art_iterator_t *)&iterator,(art_t *)&art,(art_key_chunk_t *)"000005");
  _assert_true((ulong)(iterator.value != (art_val_t *)0x0),"iterator.value != NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x20f);
  assert_key_eq(iterator.key,
                (art_key_chunk_t *)
                keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start[4]);
  _assert_true((ulong)(*iterator.value ==
                      values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[4]),"*iterator.value == values[4]",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x211);
  _Var1 = art_iterator_next((art_iterator_t *)&iterator);
  _assert_true((ulong)!_Var1,"art_iterator_next(&iterator)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x212);
  art_upper_bound((art_iterator_t *)&iterator,(art_t *)&art,(art_key_chunk_t *)"001006");
  _assert_true((ulong)(iterator.value == (art_val_t *)0x0),"iterator.value == NULL",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/art_unit.cpp"
               ,0x217);
  art_free((art_t *)&art);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&keys.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return;
}

Assistant:

DEFINE_TEST(test_art_upper_bound) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<art_val_t> values = {1, 2, 3, 4, 5};
    art_t art;
    art_init_cleared(&art);
    for (size_t i = 0; i < keys.size(); ++i) {
        art_insert(&art, (art_key_chunk_t*)keys[i], values[i]);
        assert_art_valid(&art);
    }

    {
        const char* key = "000002";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        size_t i = 2;
        do {
            assert_true(iterator.value != NULL);
            assert_key_eq(iterator.key, (art_key_chunk_t*)keys[i]);
            assert_true(*iterator.value == values[i]);
            ++i;
        } while (art_iterator_next(&iterator));
    }
    {
        const char* key = "000005";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value != NULL);
        assert_key_eq(iterator.key, (art_key_chunk_t*)keys[4]);
        assert_true(*iterator.value == values[4]);
        assert_false(art_iterator_next(&iterator));
    }
    {
        const char* key = "001006";
        art_iterator_t iterator = art_upper_bound(&art, (art_key_chunk_t*)key);
        assert_true(iterator.value == NULL);
    }
    art_free(&art);
}